

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_sort.cpp
# Opt level: O2

LOs __thiscall Omega_h::sort_by_keys<int>(Omega_h *this,Read<int> *keys,Int width)

{
  int iVar1;
  void *extraout_RDX;
  ulong uVar2;
  Write<int> *this_00;
  LOs LVar3;
  allocator local_a1;
  Write<int> perm;
  string local_90;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> local_50;
  Write<int> local_40;
  
  switch(width) {
  case 1:
    Write<int>::Write(&local_40,&keys->write_);
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)local_40.shared_alloc_.alloc & 1) == 0) {
      uVar2 = (local_40.shared_alloc_.alloc)->size;
    }
    else {
      uVar2 = (ulong)local_40.shared_alloc_.alloc >> 3;
    }
    std::__cxx11::string::string((string *)&local_90,"",&local_a1);
    iVar1 = (int)(uVar2 >> 2);
    Write<int>::Write(&perm,iVar1,0,1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    begin_code("parallel_sort",(char *)0x0);
    std::__stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,1>>>
              ((int *)perm.shared_alloc_.direct_ptr,
               (int *)((long)iVar1 * 4 + (long)perm.shared_alloc_.direct_ptr),
               (_Iter_comp_iter<Omega_h::CompareKeySets<int,_1>_>)local_40.shared_alloc_.direct_ptr)
    ;
    end_code();
    end_code();
    Write<int>::Write((Write<int> *)&local_90,&perm);
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    Write<int>::~Write((Write<int> *)&local_90);
    Write<int>::~Write(&perm);
    this_00 = &local_40;
    break;
  case 2:
    Write<int>::Write(&local_50,&keys->write_);
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)local_50.shared_alloc_.alloc & 1) == 0) {
      uVar2 = (local_50.shared_alloc_.alloc)->size;
    }
    else {
      uVar2 = (ulong)local_50.shared_alloc_.alloc >> 3;
    }
    iVar1 = divide_no_remainder<int>((int)(uVar2 >> 2),2);
    std::__cxx11::string::string((string *)&local_90,"",&local_a1);
    Write<int>::Write(&perm,iVar1,0,1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    begin_code("parallel_sort",(char *)0x0);
    std::__stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,2>>>
              ((int *)perm.shared_alloc_.direct_ptr,
               (int *)((long)perm.shared_alloc_.direct_ptr + (long)iVar1 * 4),
               (_Iter_comp_iter<Omega_h::CompareKeySets<int,_2>_>)local_50.shared_alloc_.direct_ptr)
    ;
    end_code();
    end_code();
    Write<int>::Write((Write<int> *)&local_90,&perm);
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    Write<int>::~Write((Write<int> *)&local_90);
    Write<int>::~Write(&perm);
    this_00 = &local_50;
    break;
  case 3:
    Write<int>::Write(&local_60,&keys->write_);
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)local_60.shared_alloc_.alloc & 1) == 0) {
      uVar2 = (local_60.shared_alloc_.alloc)->size;
    }
    else {
      uVar2 = (ulong)local_60.shared_alloc_.alloc >> 3;
    }
    iVar1 = divide_no_remainder<int>((int)(uVar2 >> 2),3);
    std::__cxx11::string::string((string *)&local_90,"",&local_a1);
    Write<int>::Write(&perm,iVar1,0,1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    begin_code("parallel_sort",(char *)0x0);
    std::__stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,3>>>
              ((int *)perm.shared_alloc_.direct_ptr,
               (int *)((long)perm.shared_alloc_.direct_ptr + (long)iVar1 * 4),
               (_Iter_comp_iter<Omega_h::CompareKeySets<int,_3>_>)local_60.shared_alloc_.direct_ptr)
    ;
    end_code();
    end_code();
    Write<int>::Write((Write<int> *)&local_90,&perm);
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    Write<int>::~Write((Write<int> *)&local_90);
    Write<int>::~Write(&perm);
    this_00 = &local_60;
    break;
  case 4:
    Write<int>::Write(&local_70,&keys->write_);
    begin_code("sort_by_keys",(char *)0x0);
    if (((ulong)local_70.shared_alloc_.alloc & 1) == 0) {
      uVar2 = (local_70.shared_alloc_.alloc)->size;
    }
    else {
      uVar2 = (ulong)local_70.shared_alloc_.alloc >> 3;
    }
    iVar1 = divide_no_remainder<int>((int)(uVar2 >> 2),4);
    std::__cxx11::string::string((string *)&local_90,"",&local_a1);
    Write<int>::Write(&perm,iVar1,0,1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    begin_code("parallel_sort",(char *)0x0);
    std::__stable_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Omega_h::CompareKeySets<int,4>>>
              ((int *)perm.shared_alloc_.direct_ptr,
               (int *)((long)perm.shared_alloc_.direct_ptr + (long)iVar1 * 4),
               (_Iter_comp_iter<Omega_h::CompareKeySets<int,_4>_>)local_70.shared_alloc_.direct_ptr)
    ;
    end_code();
    end_code();
    Write<int>::Write((Write<int> *)&local_90,&perm);
    Read<int>::Read((Read<signed_char> *)this,(Write<int> *)&local_90);
    Write<int>::~Write((Write<int> *)&local_90);
    Write<int>::~Write(&perm);
    this_00 = &local_70;
    break;
  default:
    fail("assertion %s failed at %s +%d\n","false",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_sort.cpp"
         ,0x5b);
  }
  Write<int>::~Write(this_00);
  LVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar3.write_.shared_alloc_;
}

Assistant:

LOs sort_by_keys(Read<T> keys, Int width) {
  if (width == 1) return sort_by_keys_tmpl<1>(keys);
  if (width == 2) return sort_by_keys_tmpl<2>(keys);
  if (width == 3) return sort_by_keys_tmpl<3>(keys);
  if (width == 4) return sort_by_keys_tmpl<4>(keys);
  OMEGA_H_NORETURN(LOs());
}